

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void int_list_intersect(int *a,int *b,int *c)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
code_r0x0012d91d:
  iVar1 = *b;
  if (-1 < iVar1) {
    iVar2 = *c;
    while (-1 < iVar2) {
      while( true ) {
        piVar3 = b + 1;
        if (iVar1 == iVar2) {
          *a = iVar2;
          a = a + 1;
          c = c + 1;
          b = piVar3;
          goto code_r0x0012d91d;
        }
        if (iVar2 <= iVar1) break;
        iVar1 = *piVar3;
        b = piVar3;
        if (iVar1 < 0) goto LAB_0012d958;
      }
      piVar3 = c + 1;
      c = c + 1;
      iVar2 = *piVar3;
    }
  }
LAB_0012d958:
  *a = -1;
  return;
}

Assistant:

void int_list_intersect(int *a, int *b, int *c) {
  while (1) {
    if (*b < 0) break;
  Lagainc:
    if (*c < 0) break;
  Lagainb:
    if (*b == *c) {
      *a++ = *b++;
      c++;
      continue;
    }
    if (*b < *c) {
      b++;
      if (*b < 0) break;
      goto Lagainb;
    }
    if (*c < *b) {
      c++;
      goto Lagainc;
    }
  }
  *a++ = -1;
}